

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractTestExample.cpp
# Opt level: O3

void __thiscall AbstractTestExample::UpdateDataInfo(AbstractTestExample *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  long *plVar4;
  ostream *poVar5;
  int iVar6;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"postive   ",10);
  plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->positiveN);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"negative  ",10);
  plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->negtiveN);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"imbalance ",10);
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 4;
  uVar1 = this->positiveN;
  uVar2 = this->negtiveN;
  poVar5 = std::ostream::_M_insert<double>((double)(int)uVar2 / (double)(int)uVar1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  iVar6 = (int)((double)this->instanceN * 0.2);
  this->testN = iVar6;
  this->trainN = this->instanceN - iVar6;
  iVar3 = (int)((double)this->positiveN * 0.2);
  this->posNtest = iVar3;
  this->negNtest = iVar6 - iVar3;
  this->posNtrain = this->positiveN - iVar3;
  this->negNtrain = this->negtiveN - (iVar6 - iVar3);
  return;
}

Assistant:

void AbstractTestExample::UpdateDataInfo()
{
    std::cout<<"postive   "<<positiveN<<std::endl;
    std::cout<<"negative  "<<negtiveN<<std::endl;
    std::cout<<"imbalance "<<std::setprecision(4)<<static_cast<double>(negtiveN)/positiveN<<std::endl;
    
    double testRate=0.2;
    testN=instanceN*testRate;
    trainN=instanceN-testN;
    posNtest=positiveN*testRate;
    negNtest=testN-posNtest;
    posNtrain=positiveN-posNtest;
    negNtrain=negtiveN-negNtest;
}